

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O0

iterator * __thiscall
diy::
concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
::end(concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
      *this)

{
  iterator_<std::_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
  *in_RDI;
  map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
  *in_stack_ffffffffffffffa8;
  
  Catch::clara::std::
  map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
  ::end(in_stack_ffffffffffffffa8);
  Catch::clara::std::shared_ptr<std::unique_lock<tthread::fast_mutex>_>::shared_ptr
            ((shared_ptr<std::unique_lock<tthread::fast_mutex>_> *)0x1ba229);
  iterator_<std::_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
  ::iterator_(in_RDI,(_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>
                      *)in_stack_ffffffffffffffa8,(SharedPtr *)0x1ba23d);
  Catch::clara::std::shared_ptr<std::unique_lock<tthread::fast_mutex>_>::~shared_ptr
            ((shared_ptr<std::unique_lock<tthread::fast_mutex>_> *)0x1ba249);
  return in_RDI;
}

Assistant:

iterator        end()                   { return iterator(map_.end()); }